

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O2

bool __thiscall
QStringListModel::setData(QStringListModel *this,QModelIndex *index,QVariant *value,int role)

{
  bool bVar1;
  long in_FS_OFFSET;
  initializer_list<int> args;
  QArrayDataPointer<int> local_60;
  QArrayDataPointer<char16_t> local_48;
  int local_28 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  if (((-1 < (long)index->r) && (bVar1 = false, (role & 0xfffffffdU) == 0)) &&
     (bVar1 = false, (ulong)(long)index->r < *(ulong *)(this + 0x20))) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toString((QString *)&local_48,value);
    bVar1 = ::comparesEqual((QString *)((long)index->r * 0x18 + *(long *)(this + 0x18)),
                            (QString *)&local_48);
    if (!bVar1) {
      QList<QString>::replace
                ((QList<QString> *)(this + 0x10),(long)index->r,(parameter_type)&local_48);
      local_28[0] = 0;
      local_28[1] = 2;
      args._M_len = 2;
      args._M_array = local_28;
      QList<int>::QList((QList<int> *)&local_60,args);
      QAbstractItemModel::dataChanged
                ((QAbstractItemModel *)this,index,index,(QList<int> *)&local_60);
      QArrayDataPointer<int>::~QArrayDataPointer(&local_60);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (index.row() >= 0 && index.row() < lst.size()
        && (role == Qt::EditRole || role == Qt::DisplayRole)) {
        const QString valueString = value.toString();
        if (lst.at(index.row()) == valueString)
            return true;
        lst.replace(index.row(), valueString);
        emit dataChanged(index, index, {Qt::DisplayRole, Qt::EditRole});
        return true;
    }
    return false;
}